

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_option.c
# Opt level: O3

light_option light_get_option(light_pcapng pcapng,uint16_t option_code)

{
  if (pcapng != (light_pcapng)0x0) {
    while( true ) {
      pcapng = (light_pcapng)pcapng->options;
      if (pcapng == (light_pcapng)0x0) break;
      if ((uint16_t)pcapng->block_type == option_code) {
        return (light_option)pcapng;
      }
    }
  }
  return (light_option)0x0;
}

Assistant:

light_option light_get_option(const light_pcapng pcapng, uint16_t option_code)
{
	if (pcapng == NULL) {
		return NULL;
	}

	light_option iterator = pcapng->options;

	while (iterator != NULL) {
		if (iterator->custom_option_code == option_code) {
			break;
		}
		iterator = iterator->next_option;
	}

	return iterator;
}